

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu
          (optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *__return_storage_ptr__,
          dwarf_resolver *this,Dwarf_Addr pc)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  bool bVar1;
  int iVar2;
  cache_mode cVar3;
  Dwarf_Bool DVar4;
  Dwarf_Die die;
  skeleton_info *this_00;
  skeleton_info *cu_die_00;
  skeleton_info *psVar5;
  pointer pcVar6;
  pointer cu_die_01;
  pointer pcVar7;
  char *in_stack_fffffffffffffdf8;
  __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
  *this_01;
  undefined8 in_stack_fffffffffffffe00;
  cu_info *value;
  cu_info local_178;
  __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
  local_148 [2];
  cu_entry *local_138;
  cu_entry *local_130;
  __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
  local_128;
  __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
  vec_it;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_108;
  undefined1 local_e1;
  cu_info local_e0;
  source_location local_b0 [2];
  Dwarf_Half local_8c [2];
  undefined1 local_88 [4];
  Dwarf_Half dwversion;
  Dwarf_Half offset_size;
  die_object cu_die;
  Dwarf_Die *local_68;
  bool local_59;
  Dwarf_Die local_58;
  Dwarf_Die raw_die;
  unsigned_long_long *local_40;
  unsigned_long_long local_38;
  Dwarf_Off cu_die_offset;
  Dwarf_Arange_s *local_28;
  Dwarf_Arange arange;
  Dwarf_Addr pc_local;
  dwarf_resolver *this_local;
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *info;
  
  arange = (Dwarf_Arange)pc;
  pc_local = (Dwarf_Addr)this;
  this_local = (dwarf_resolver *)__return_storage_ptr__;
  if ((this->aranges != (Dwarf_Arange *)0x0) &&
     (bVar1 = detail::optional::operator_cast_to_bool((optional *)&this->skeleton), !bVar1)) {
    cu_die_offset = (Dwarf_Off)&local_28;
    iVar2 = wrap<Dwarf_Arange_s_**,_unsigned_long_long,_unsigned_long_long,_Dwarf_Arange_s_**,_Dwarf_Error_s_**,_Dwarf_Arange_s_**&,_long_long_&,_unsigned_long_long_&,_Dwarf_Arange_s_**,_0>
                      (this,dwarf_get_arange,&this->aranges,&this->arange_count,
                       (unsigned_long_long *)&arange,(Dwarf_Arange_s ***)&cu_die_offset);
    if (iVar2 == 0) {
      local_40 = &local_38;
      iVar2 = wrap<Dwarf_Arange_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Arange_s_*&,_unsigned_long_long_*,_0>
                        (this,dwarf_get_cu_die_offset,&local_28,&local_40);
      source_location::source_location
                ((source_location *)&raw_die,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                 ,0x355);
      location._8_8_ = in_stack_fffffffffffffe00;
      location.file = in_stack_fffffffffffffdf8;
      assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x33d180,
                        "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                        ,(char *)raw_die,location);
      local_59 = true;
      local_68 = &local_58;
      iVar2 = wrap<Dwarf_Debug_s_*,_unsigned_long_long,_int,_Dwarf_Die_s_**,_Dwarf_Error_s_**,_Dwarf_Debug_s_*&,_unsigned_long_long_&,_bool,_Dwarf_Die_s_**,_0>
                        (this,dwarf_offdie_b,&this->dbg,&local_38,&local_59,&local_68);
      source_location::source_location
                ((source_location *)&cu_die.die,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                 ,0x358);
      location_00._8_8_ = in_stack_fffffffffffffe00;
      location_00.file = in_stack_fffffffffffffdf8;
      assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x33d217,
                        "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                        ,(char *)cu_die.die,location_00);
      die_object::die_object((die_object *)local_88,this->dbg,local_58);
      local_8c[1] = 0;
      local_8c[0] = 0;
      die = die_object::get((die_object *)local_88);
      iVar2 = dwarf_get_version_of_die(die,local_8c,local_8c + 1);
      source_location::source_location
                (local_b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                 ,0x35c);
      location_01._8_8_ = in_stack_fffffffffffffe00;
      location_01.file = in_stack_fffffffffffffdf8;
      assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x33d25d,
                        "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                        ,local_b0[0].file,location_01);
      maybe_owned_die_object::owned(&local_e0.cu_die,(die_object *)local_88);
      local_e0.dwversion = local_8c[0];
      optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::
      optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>
                (__return_storage_ptr__,&local_e0);
      cu_info::~cu_info(&local_e0);
      die_object::~die_object((die_object *)local_88);
      return __return_storage_ptr__;
    }
  }
  cVar3 = get_cache_mode();
  if (cVar3 == prioritize_memory) {
    local_e1 = 0;
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::optional
              (__return_storage_ptr__);
    vec_it._M_current = (cu_entry *)this;
    std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
    function<cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(unsigned_long_long)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
              ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_108,
               (anon_class_24_3_e602f920 *)&vec_it);
    walk_compilation_units(this,&local_108);
    std::function<bool_(const_cpptrace::detail::libdwarf::die_object_&)>::~function(&local_108);
    return __return_storage_ptr__;
  }
  lazy_generate_cu_cache(this);
  local_130 = (cu_entry *)
              std::
              vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
              ::begin(&this->cu_cache);
  local_138 = (cu_entry *)
              std::
              vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
              ::end(&this->cu_cache);
  local_128 = first_less_than_or_equal<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::cu_entry*,std::vector<cpptrace::detail::libdwarf::cu_entry,std::allocator<cpptrace::detail::libdwarf::cu_entry>>>,unsigned_long_long,cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(unsigned_long_long)::_lambda(unsigned_long_long,cpptrace::detail::libdwarf::cu_entry_const&)_1_>
                        (local_130,local_138,&arange);
  local_148[0]._M_current =
       (cu_entry *)
       std::
       vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
       ::end(&this->cu_cache);
  bVar1 = __gnu_cxx::operator!=(&local_128,local_148);
  if (bVar1) {
    bVar1 = detail::optional::operator_cast_to_bool((optional *)&this->skeleton);
    if (bVar1) {
      this_00 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
      cu_die_00 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
      psVar5 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
      DVar4 = die_object::pc_in_die
                        (&this_00->cu_die,&cu_die_00->cu_die,(uint)psVar5->dwversion,
                         (Dwarf_Addr)arange);
      if (DVar4 == 0) goto LAB_00282d9b;
    }
    else {
LAB_00282d9b:
      pcVar6 = __gnu_cxx::
               __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
               ::operator->(&local_128);
      cu_die_01 = __gnu_cxx::
                  __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
                  ::operator->(&local_128);
      pcVar7 = __gnu_cxx::
               __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
               ::operator->(&local_128);
      DVar4 = die_object::pc_in_die
                        (&pcVar6->die,&cu_die_01->die,(uint)pcVar7->dwversion,(Dwarf_Addr)arange);
      if (DVar4 == 0) goto LAB_00282e78;
    }
    this_01 = &local_128;
    pcVar6 = __gnu_cxx::
             __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
             ::operator->(this_01);
    value = &local_178;
    maybe_owned_die_object::ref(&value->cu_die,&pcVar6->die);
    pcVar6 = __gnu_cxx::
             __normal_iterator<cpptrace::detail::libdwarf::cu_entry_*,_std::vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>_>
             ::operator->(this_01);
    local_178.dwversion = pcVar6->dwversion;
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>(__return_storage_ptr__,value);
    cu_info::~cu_info(&local_178);
  }
  else {
LAB_00282e78:
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<cu_info> lookup_cu(Dwarf_Addr pc) {
            // Check for .debug_aranges for fast lookup
            if(aranges && !skeleton) { // don't bother under split dwarf
                // Try to find pc in aranges
                Dwarf_Arange arange;
                if(wrap(dwarf_get_arange, aranges, arange_count, pc, &arange) == DW_DLV_OK) {
                    // Address in table, load CU die
                    Dwarf_Off cu_die_offset;
                    VERIFY(wrap(dwarf_get_cu_die_offset, arange, &cu_die_offset) == DW_DLV_OK);
                    Dwarf_Die raw_die;
                    // Setting is_info = true for now, assuming in .debug_info rather than .debug_types
                    VERIFY(wrap(dwarf_offdie_b, dbg, cu_die_offset, true, &raw_die) == DW_DLV_OK);
                    die_object cu_die(dbg, raw_die);
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    VERIFY(dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size) == DW_DLV_OK);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "Found CU in aranges\n");
                        cu_die.print();
                    }
                    return cu_info{maybe_owned_die_object::owned(std::move(cu_die)), dwversion};
                }
            }
            // otherwise, or if not in aranges
            // one reason to fallback here is if the compilation has dwarf generated from different compilers and only
            // some of them generate aranges (e.g. static linking with cpptrace after specifying clang++ as the c++
            // compiler while the C compiler defaults to an older gcc)
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                // walk for the cu and go from there
                optional<cu_info> info;
                walk_compilation_units([this, pc, &info] (const die_object& cu_die) {
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                    //auto p = cu_die.get_pc_range(dwversion);
                    //cu_die.print();
                    //fprintf(stderr, "        %llx, %llx\n", p.first, p.second);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "CU: %d %s\n", dwversion, cu_die.get_name().c_str());
                    }
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || cu_die.pc_in_die(cu_die, dwversion, pc)
                    ) {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "pc in die %08llx %s (now searching for %08llx)\n",
                                to_ull(cu_die.get_global_offset()),
                                cu_die.get_tag_name(),
                                to_ull(pc)
                            );
                        }
                        info = cu_info{maybe_owned_die_object::owned(cu_die.clone()), dwversion};
                        return false;
                    }
                    return true;
                });
                return info;
            } else {
                lazy_generate_cu_cache();
                // look up the cu
                auto vec_it = first_less_than_or_equal(
                    cu_cache.begin(),
                    cu_cache.end(),
                    pc,
                    [] (Dwarf_Addr pc, const cu_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // TODO: Vec-it is already range-based, this range check is redundant
                // If the vector has been empty this can happen
                if(vec_it != cu_cache.end()) {
                    // TODO: Cache the range list?
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || vec_it->die.pc_in_die(vec_it->die, vec_it->dwversion, pc)
                    ) {
                        return cu_info{maybe_owned_die_object::ref(vec_it->die), vec_it->dwversion};
                    }
                } else {
                    // I've had this happen for _start, where there is a cached CU for the object but _start is outside
                    // of the CU's PC range
                    // ASSERT(cu_cache.size() == 0, "Vec should be empty?");
                }
                return nullopt;
            }
        }